

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O0

bool __thiscall leveldb::TestHashFilter::KeyMayMatch(TestHashFilter *this,Slice *key,Slice *filter)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_t sVar4;
  long local_38;
  size_t i;
  uint32_t h;
  Slice *filter_local;
  Slice *key_local;
  TestHashFilter *this_local;
  
  pcVar3 = Slice::data(key);
  sVar4 = Slice::size(key);
  uVar1 = Hash(pcVar3,sVar4,1);
  local_38 = 0;
  while( true ) {
    sVar4 = Slice::size(filter);
    if (sVar4 < local_38 + 4U) {
      return false;
    }
    pcVar3 = Slice::data(filter);
    uVar2 = DecodeFixed32(pcVar3 + local_38);
    if (uVar1 == uVar2) break;
    local_38 = local_38 + 4;
  }
  return true;
}

Assistant:

bool KeyMayMatch(const Slice& key, const Slice& filter) const override {
    uint32_t h = Hash(key.data(), key.size(), 1);
    for (size_t i = 0; i + 4 <= filter.size(); i += 4) {
      if (h == DecodeFixed32(filter.data() + i)) {
        return true;
      }
    }
    return false;
  }